

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroup::FetchRow
          (RowGroup *this,TransactionData transaction,ColumnFetchState *state,
          vector<duckdb::StorageIndex,_true> *column_ids,row_t row_id,DataChunk *result,
          idx_t result_idx)

{
  const_reference pvVar1;
  reference this_00;
  ColumnData *pCVar2;
  size_type __n;
  
  if ((column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::StorageIndex,_true>::operator[](column_ids,__n);
      this_00 = vector<duckdb::Vector,_true>::operator[](&result->data,__n);
      if (pvVar1->index == 0xffffffffffffffff) {
        Vector::SetVectorType(this_00,FLAT_VECTOR);
        *(row_t *)(this_00->data + result_idx * 8) = row_id;
      }
      else {
        pCVar2 = GetColumn(this,pvVar1->index);
        (*pCVar2->_vptr_ColumnData[0x16])
                  (pCVar2,state,row_id,this_00,result_idx,pCVar2->_vptr_ColumnData,
                   transaction.transaction.ptr._0_4_,(undefined4)transaction.transaction_id,
                   transaction.start_time);
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(column_ids->
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ).
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(column_ids->
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ).
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return;
}

Assistant:

void RowGroup::FetchRow(TransactionData transaction, ColumnFetchState &state, const vector<StorageIndex> &column_ids,
                        row_t row_id, DataChunk &result, idx_t result_idx) {
	for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
		auto &column = column_ids[col_idx];
		auto &result_vector = result.data[col_idx];
		D_ASSERT(result_vector.GetVectorType() == VectorType::FLAT_VECTOR);
		D_ASSERT(!FlatVector::IsNull(result_vector, result_idx));
		if (column.IsRowIdColumn()) {
			// row id column: fill in the row ids
			D_ASSERT(result_vector.GetType().InternalType() == PhysicalType::INT64);
			result_vector.SetVectorType(VectorType::FLAT_VECTOR);
			auto data = FlatVector::GetData<row_t>(result_vector);
			data[result_idx] = row_id;
		} else {
			// regular column: fetch data from the base column
			auto &col_data = GetColumn(column);
			col_data.FetchRow(transaction, state, row_id, result_vector, result_idx);
		}
	}
}